

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_pipeline
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  uint _h;
  _func_int *p_Var3;
  ulong uVar4;
  Layer *pLVar5;
  _func_int **pp_Var6;
  int _w;
  ParamDict pd;
  Mat weight_data_tmp;
  
  pp_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx2;
  p_Var3 = pp_Var6[-3];
  if (*(int *)(&this->field_0x160 + (long)p_Var3) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var3)) {
  case 1:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    break;
  case 2:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x118 + (long)p_Var3));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    break;
  case 3:
    pLVar5 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x118 + (long)p_Var3));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0x118 + (long)p_Var3) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    break;
  case 4:
    pLVar5 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    break;
  case 5:
    pLVar5 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    break;
  case 6:
    pLVar5 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x118 + (long)p_Var3));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0x118 + (long)p_Var3) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    break;
  default:
    pLVar5 = (Layer *)0x0;
    goto LAB_00254357;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
  pp_Var6 = this->_vptr_ConvolutionDepthWise_x86_avx2;
LAB_00254357:
  this->activation = pLVar5;
  p_Var3 = pp_Var6[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x178 + (long)p_Var3) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var3);
  iVar2 = *(int *)(&this->field_0xd8 + (long)p_Var3);
  _w = iVar2 * iVar1;
  _h = *(uint *)(&this->field_0x108 + (long)p_Var3);
  uVar4 = (long)*(int *)(&this->field_0x104 + (long)p_Var3) / (long)(int)_h;
  uVar4 = (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / (long)_w;
  if ((_h != *(uint *)(&this->field_0xd0 + (long)p_Var3)) ||
     ((int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
           (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var3) / (int)_h)) * _h != _h))
  goto LAB_00254435;
  if (opt->use_packing_layout == true) {
    if ((_h & 7) == 0) {
      if ((((iVar2 == 3) && (iVar1 == 3)) && (opt->use_weight_fp16_storage != false)) &&
         (*(int *)(&this->field_0xdc + (long)p_Var3) == 1)) {
        if (((*(int *)(&this->field_0xe0 + (long)p_Var3) == 1) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var3) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var3) == 1)) {
          Mat::reshape((Mat *)&pd,(Mat *)(&this->field_0x168 + (long)p_Var3),_w,_h,(Allocator *)0x0)
          ;
          weight_data_tmp.cstep = 0;
          weight_data_tmp.data = (void *)0x0;
          weight_data_tmp.refcount._0_4_ = 0;
          weight_data_tmp.refcount._4_4_ = 0;
          weight_data_tmp.elemsize._0_4_ = 0;
          weight_data_tmp._20_8_ = 0;
          weight_data_tmp.allocator = (Allocator *)0x0;
          weight_data_tmp.dims = 0;
          weight_data_tmp.w = 0;
          weight_data_tmp.h = 0;
          weight_data_tmp.d = 0;
          weight_data_tmp.c = 0;
          convert_packing((Mat *)&pd,&weight_data_tmp,8,opt);
          cast_float32_to_float16(&weight_data_tmp,&this->weight_data_packed,opt);
        }
        else {
          if (((*(int *)(&this->field_0xe0 + (long)p_Var3) != 1) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var3) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var3) != 2)) goto LAB_002545c7;
          Mat::reshape((Mat *)&pd,(Mat *)(&this->field_0x168 + (long)p_Var3),_w,_h,(Allocator *)0x0)
          ;
          weight_data_tmp.cstep = 0;
          weight_data_tmp.data = (void *)0x0;
          weight_data_tmp.refcount._0_4_ = 0;
          weight_data_tmp.refcount._4_4_ = 0;
          weight_data_tmp.elemsize._0_4_ = 0;
          weight_data_tmp._20_8_ = 0;
          weight_data_tmp.allocator = (Allocator *)0x0;
          weight_data_tmp.dims = 0;
          weight_data_tmp.w = 0;
          weight_data_tmp.h = 0;
          weight_data_tmp.d = 0;
          weight_data_tmp.c = 0;
          convert_packing((Mat *)&pd,&weight_data_tmp,8,opt);
          cast_float32_to_float16(&weight_data_tmp,&this->weight_data_packed,opt);
        }
        Mat::~Mat(&weight_data_tmp);
      }
      else {
LAB_002545c7:
        Mat::reshape((Mat *)&pd,(Mat *)(&this->field_0x168 + (long)p_Var3),_w,_h,(Allocator *)0x0);
        convert_packing((Mat *)&pd,&this->weight_data_packed,8,opt);
      }
LAB_002545f6:
      Mat::~Mat((Mat *)&pd);
      return 0;
    }
    if ((_h & 3) == 0) {
      Mat::reshape((Mat *)&pd,(Mat *)(&this->field_0x168 + (long)p_Var3),_w,_h,(Allocator *)0x0);
      convert_packing((Mat *)&pd,&this->weight_data_packed,4,opt);
      goto LAB_002545f6;
    }
  }
  if ((iVar2 == 3 && iVar1 == 3) && (*(int *)(&this->field_0xdc + (long)p_Var3) == 1)) {
    if ((*(int *)(&this->field_0xe0 + (long)p_Var3) == 1) &&
       ((*(int *)(&this->field_0xe4 + (long)p_Var3) == 1 &&
        (*(int *)(&this->field_0xe8 + (long)p_Var3) == 1)))) {
      return 0;
    }
    if (((*(int *)(&this->field_0xe0 + (long)p_Var3) == 1) &&
        (*(int *)(&this->field_0xe4 + (long)p_Var3) == 2)) &&
       (*(int *)(&this->field_0xe8 + (long)p_Var3) == 2)) {
      return 0;
    }
  }
LAB_00254435:
  create_group_ops(this,opt);
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack8
        if (elempack == 8)
        {
#if __AVX2__
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
#endif
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 8, opt);

            return 0;
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 4, opt);

            return 0;
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                return 0;
            }
        }
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}